

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbrt2pbf.cpp
# Opt level: O3

void pbrt::semantic::pbrt2pbf(int ac,char **av)

{
  char *__s;
  _Alloc_hider _Var1;
  size_type sVar2;
  int iVar3;
  ostream *poVar4;
  long *plVar5;
  undefined8 extraout_RAX;
  size_type *psVar6;
  int iVar7;
  bool bVar8;
  string arg;
  SP scene;
  string outFileName;
  string inFileName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  string local_98;
  char **local_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  local_78 = av;
  if (1 < ac) {
    iVar7 = 1;
    do {
      std::__cxx11::string::string((string *)&local_d8,local_78[iVar7],(allocator *)&local_b8);
      iVar3 = std::__cxx11::string::compare((char *)&local_d8);
      sVar2 = local_98._M_string_length;
      if (iVar3 == 0) {
        __s = local_78[(long)iVar7 + 1];
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)&local_98,0,(char *)sVar2,(ulong)__s);
        iVar7 = iVar7 + 1;
      }
      else {
        if (*local_d8._M_dataplus._M_p == '-') {
          std::operator+(&local_50,"invalid argument \'",&local_d8);
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
          local_b8._M_dataplus._M_p = (pointer)*plVar5;
          psVar6 = (size_type *)(plVar5 + 2);
          if ((size_type *)local_b8._M_dataplus._M_p == psVar6) {
            local_b8.field_2._M_allocated_capacity = *psVar6;
            local_b8.field_2._8_8_ = plVar5[3];
            local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
          }
          else {
            local_b8.field_2._M_allocated_capacity = *psVar6;
          }
          local_b8._M_string_length = plVar5[1];
          *plVar5 = (long)psVar6;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          usage(&local_b8);
          goto LAB_0010d3e1;
        }
        std::__cxx11::string::_M_assign((string *)&local_70);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 < ac);
  }
  iVar7 = std::__cxx11::string::compare((char *)&local_98);
  if (iVar7 == 0) {
LAB_0010d3e1:
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,"no output file specified (-o <file.pbff>)","");
    usage(&local_d8);
  }
  else {
    iVar7 = std::__cxx11::string::compare((char *)&local_70);
    if (iVar7 != 0) {
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,".pbf","");
      std::__cxx11::string::substr((ulong)&local_d8,(ulong)&local_98);
      _Var1._M_p = local_d8._M_dataplus._M_p;
      if (local_d8._M_string_length == local_b8._M_string_length) {
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._M_string_length ==
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          bVar8 = true;
        }
        else {
          iVar7 = bcmp(local_d8._M_dataplus._M_p,local_b8._M_dataplus._M_p,local_d8._M_string_length
                      );
          bVar8 = iVar7 == 0;
        }
      }
      else {
        bVar8 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var1._M_p != &local_d8.field_2) {
        operator_delete(_Var1._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p);
      }
      if (!bVar8) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "output file name missing \'.pbsf\' extension - adding it ...",0x3a);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
        std::ostream::put(-0x78);
        std::ostream::flush();
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d8,local_98._M_dataplus._M_p,
                   local_98._M_dataplus._M_p + local_98._M_string_length);
        std::__cxx11::string::append((char *)&local_d8);
        std::__cxx11::string::operator=((string *)&local_98,(string *)&local_d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p);
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"-------------------------------------------------------",
                 0x37);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
      std::ostream::put(-0x78);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"parsing pbrt file ",0x12);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_70._M_dataplus._M_p,local_70._M_string_length)
      ;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"");
      importPBRT((pbrt *)&local_b8,&local_70,&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\x1b[1;32m done importing scene.\x1b[0m",0x21);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
      std::ostream::put(-0x78);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"writing to binary file ",0x17);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_98._M_dataplus._M_p,local_98._M_string_length)
      ;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      Scene::saveTo((Scene *)local_b8._M_dataplus._M_p,&local_98);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\x1b[1;32m => yay! writing successful...\x1b[0m",0x29);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
      std::ostream::put(-0x78);
      std::ostream::flush();
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._M_string_length);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      return;
    }
  }
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d8,"no input pbrt file specified","");
  usage(&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void pbrt2pbf(int ac, char **av)
    {
      std::string inFileName;
      std::string outFileName;
      for (int i=1;i<ac;i++) {
        const std::string arg = av[i];
        if (arg == "-o") {
          assert(i+1 < ac);
          outFileName = av[++i];
        } else if (arg[0] != '-') {
          inFileName = arg;
        } else {
          usage("invalid argument '"+arg+"'");
        }          
      }

      if (outFileName == "")
        usage("no output file specified (-o <file.pbff>)");
      if (inFileName == "")
        usage("no input pbrt file specified");

      if (!endsWith(outFileName,".pbf")) {
        std::cout << "output file name missing '.pbsf' extension - adding it ..." << std::endl;
        outFileName = outFileName+".pbf";
      }
      
      std::cout << "-------------------------------------------------------" << std::endl;
      std::cout << "parsing pbrt file " << inFileName << std::endl;
      // try {
        Scene::SP scene = importPBRT(inFileName);
        std::cout << "\033[1;32m done importing scene.\033[0m" << std::endl;
        std::cout << "writing to binary file " << outFileName << std::endl;
        scene->saveTo(outFileName);
        std::cout << "\033[1;32m => yay! writing successful...\033[0m" << std::endl;
      // } catch (std::runtime_error &e) {
      //   cout << "\033[1;31mError in parsing: " << e.what() << "\033[0m\n";
      //   throw e;
      // }
    }